

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void embree::SceneGraph::extend_animation
               (Ref<embree::SceneGraph::Node> *node0,Ref<embree::SceneGraph::Node> *node1)

{
  Node *pNVar1;
  Node *pNVar2;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *pvVar3;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *pvVar4;
  bool bVar5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  long *plVar9;
  runtime_error *prVar10;
  long lVar11;
  iterator __begin5;
  ulong uVar12;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *pvVar13;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *pvVar14;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p_4;
  Ref<embree::SceneGraph::Node> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar1 = node0->ptr;
  if (pNVar1 != (Node *)0x0 && pNVar1 != node1->ptr) {
    plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      if ((node1->ptr != (Node *)0x0) &&
         (plVar7 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,&TransformNode::typeinfo,0),
         plVar7 != (long *)0x0)) {
        (**(code **)(*plVar7 + 0x10))(plVar7);
        Transformations::add((Transformations *)(plVar6 + 0xd),(Transformations *)(plVar7 + 0xd));
        pNVar1 = (Node *)plVar6[0x13];
        local_38.ptr = pNVar1;
        if (pNVar1 != (Node *)0x0) {
          (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
        }
        pNVar2 = (Node *)plVar7[0x13];
        local_40.ptr = pNVar2;
        if (pNVar2 != (Node *)0x0) {
          (*(pNVar2->super_RefCount)._vptr_RefCount[2])(pNVar2);
        }
        extend_animation(&local_38,&local_40);
        if (pNVar2 != (Node *)0x0) {
          (*(pNVar2->super_RefCount)._vptr_RefCount[3])(pNVar2);
        }
        if (pNVar1 != (Node *)0x0) {
          (*(pNVar1->super_RefCount)._vptr_RefCount[3])(pNVar1);
        }
        (**(code **)(*plVar7 + 0x18))(plVar7);
        (**(code **)(*plVar6 + 0x18))(plVar6);
        return;
      }
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GroupNode::typeinfo,0);
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      if ((node1->ptr != (Node *)0x0) &&
         (plVar7 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,&GroupNode::typeinfo,0),
         plVar7 != (long *)0x0)) {
        (**(code **)(*plVar7 + 0x10))(plVar7);
        lVar8 = plVar6[0xd];
        lVar11 = plVar6[0xe];
        if (lVar11 - lVar8 == plVar7[0xe] - plVar7[0xd]) {
          for (uVar12 = 0; uVar12 < (ulong)(lVar11 - lVar8 >> 3); uVar12 = uVar12 + 1) {
            pNVar1 = *(Node **)(lVar8 + uVar12 * 8);
            local_48.ptr = pNVar1;
            if (pNVar1 != (Node *)0x0) {
              (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
            }
            pNVar2 = *(Node **)(plVar7[0xd] + uVar12 * 8);
            local_50.ptr = pNVar2;
            if (pNVar2 != (Node *)0x0) {
              (*(pNVar2->super_RefCount)._vptr_RefCount[2])(pNVar2);
            }
            extend_animation(&local_48,&local_50);
            if (pNVar2 != (Node *)0x0) {
              (*(pNVar2->super_RefCount)._vptr_RefCount[3])(pNVar2);
            }
            if (pNVar1 != (Node *)0x0) {
              (*(pNVar1->super_RefCount)._vptr_RefCount[3])(pNVar1);
            }
            lVar8 = plVar6[0xd];
            lVar11 = plVar6[0xe];
          }
          (**(code **)(*plVar7 + 0x18))(plVar7);
          (**(code **)(*plVar6 + 0x18))(plVar6);
          return;
        }
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      if ((node1->ptr != (Node *)0x0) &&
         (plVar7 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,&TriangleMeshNode::typeinfo,0),
         plVar7 != (long *)0x0)) {
        (**(code **)(*plVar7 + 0x10))(plVar7);
        pvVar13 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                  plVar7[0xe];
        if (*(size_t *)(plVar6[0xe] + 8) == pvVar13->size_active) {
          pvVar3 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                   plVar7[0xf];
          for (; pvVar13 != pvVar3; pvVar13 = pvVar13 + 1) {
            std::
            vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
            ::
            emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                      ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                        *)(plVar6 + 0xe),pvVar13);
          }
          (**(code **)(*plVar7 + 0x18))(plVar7);
          (**(code **)(*plVar6 + 0x18))(plVar6);
          return;
        }
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      if ((node1->ptr != (Node *)0x0) &&
         (plVar7 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo,0),
         plVar7 != (long *)0x0)) {
        (**(code **)(*plVar7 + 0x10))(plVar7);
        pvVar13 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                  plVar7[0xe];
        if (*(size_t *)(plVar6[0xe] + 8) == pvVar13->size_active) {
          pvVar3 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                   plVar7[0xf];
          for (; pvVar13 != pvVar3; pvVar13 = pvVar13 + 1) {
            std::
            vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
            ::
            emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                      ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                        *)(plVar6 + 0xe),pvVar13);
          }
          (**(code **)(*plVar7 + 0x18))(plVar7);
          (**(code **)(*plVar6 + 0x18))(plVar6);
          return;
        }
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&HairSetNode::typeinfo,0);
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      if ((node1->ptr != (Node *)0x0) &&
         (plVar7 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,&HairSetNode::typeinfo,0),
         plVar7 != (long *)0x0)) {
        (**(code **)(*plVar7 + 0x10))(plVar7);
        pvVar14 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                  plVar7[0xf];
        if (*(size_t *)(plVar6[0xf] + 8) == pvVar14->size_active) {
          pvVar4 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                   plVar7[0x10];
          for (; pvVar14 != pvVar4; pvVar14 = pvVar14 + 1) {
            std::
            vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
            ::
            emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                      ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                        *)(plVar6 + 0xf),pvVar14);
          }
          (**(code **)(*plVar7 + 0x18))(plVar7);
          (**(code **)(*plVar6 + 0x18))(plVar6);
          return;
        }
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&PointSetNode::typeinfo,0);
    if (plVar6 == (long *)0x0) {
      plVar7 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&SubdivMeshNode::typeinfo,0);
      if (plVar7 == (long *)0x0) {
        return;
      }
      (**(code **)(*plVar7 + 0x10))(plVar7);
      if ((node1->ptr == (Node *)0x0) ||
         (plVar9 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,&SubdivMeshNode::typeinfo,0),
         plVar9 == (long *)0x0)) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      (**(code **)(*plVar9 + 0x10))(plVar9);
      if (*(long *)(plVar7[0xe] + 8) != *(long *)(plVar9[0xe] + 8)) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
LAB_0014390c:
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar5 = std::operator!=((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(plVar7 + 0x22)
                              ,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               (plVar9 + 0x22));
      if (bVar5) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
        goto LAB_0014390c;
      }
      pvVar3 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
               plVar9[0xf];
      for (pvVar13 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                     plVar9[0xe]; pvVar13 != pvVar3; pvVar13 = pvVar13 + 1) {
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)(plVar7 + 0xe),pvVar13);
      }
      (**(code **)(*plVar9 + 0x18))(plVar9);
      (**(code **)(*plVar7 + 0x18))(plVar7);
      plVar7 = (long *)0x0;
    }
    else {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      if ((node1->ptr == (Node *)0x0) ||
         (plVar7 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,&PointSetNode::typeinfo,0),
         plVar7 == (long *)0x0)) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      (**(code **)(*plVar7 + 0x10))(plVar7);
      pvVar14 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                plVar7[0xf];
      if (*(size_t *)(plVar6[0xf] + 8) != pvVar14->size_active) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"incompatible scene graph");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar4 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
               plVar7[0x10];
      for (; pvVar14 != pvVar4; pvVar14 = pvVar14 + 1) {
        std::
        vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                    *)(plVar6 + 0xf),pvVar14);
      }
      (**(code **)(*plVar7 + 0x18))(plVar7);
      plVar7 = plVar6;
    }
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar7 + 0x18))(plVar7);
    }
  }
  return;
}

Assistant:

void SceneGraph::GridMeshNode::print(std::ostream& cout, int depth) {
    cout << "GridMeshNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }